

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distribution.cpp
# Opt level: O2

void __thiscall
MxxDistribution_StableScatterBlockDistr_Test::TestBody
          (MxxDistribution_StableScatterBlockDistr_Test *this)

{
  size_t i;
  long lVar1;
  unsigned_long uVar2;
  char *pcVar3;
  ulong uVar4;
  char cVar5;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  AssertHelper local_b0;
  AssertionResult gtest_ar;
  size_t eq_size;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_> vec;
  comm c;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_> x;
  
  mxx::comm::comm(&c);
  vec._M_dataplus._M_p = (pointer)&vec.field_2;
  vec._M_string_length = 0;
  vec.field_2._M_local_buf[0] = '\0';
  if (c.m_rank == c.m_size / 2) {
    std::__cxx11::
    basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
    resize(&vec,0x28);
    for (lVar1 = 0; lVar1 != 0x28; lVar1 = lVar1 + 1) {
      vec._M_dataplus._M_p[lVar1] = (uchar)lVar1;
    }
  }
  mxx::impl::
  distribute_container<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  ::stable_distribute(&x,&vec,&c);
  mxx::impl::
  distribute_container<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  ::stable_distribute_inplace(&vec,&c);
  eq_size = 0x28 / (ulong)(long)c.m_size;
  if ((ulong)(long)c.m_rank < 0x28U % (ulong)(long)c.m_size) {
    eq_size = eq_size + 1;
  }
  uVar2 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&eq_size,&c);
  local_b8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)x._M_string_length
  ;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"eq_size","x.size()",&eq_size,(unsigned_long *)&local_b8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_distribution.cpp"
               ,0x59,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_b8);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_b8.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         vec._M_string_length;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar,"eq_size","vec.size()",&eq_size,(unsigned_long *)&local_b8);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      for (uVar4 = 0; uVar4 < eq_size; uVar4 = uVar4 + 1) {
        cVar5 = (char)uVar2 + (char)uVar4;
        local_b8.ptr_._0_1_ = cVar5;
        testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                  ((internal *)&gtest_ar,"static_cast<unsigned char>((prefix + i) % 256)","x[i]",
                   (uchar *)&local_b8,x._M_dataplus._M_p + uVar4);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_b8);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_distribution.cpp"
                     ,0x5d,pcVar3);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_b8);
LAB_00127be9:
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_b8);
          goto LAB_00127b2e;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                  ((internal *)&gtest_ar,"static_cast<unsigned char>((prefix + i) % 256)","vec[i]",
                   (uchar *)&local_b8,vec._M_dataplus._M_p + uVar4);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_b8);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_distribution.cpp"
                     ,0x5e,pcVar3);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_b8);
          goto LAB_00127be9;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
      }
      goto LAB_00127b33;
    }
    testing::Message::Message((Message *)&local_b8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_distribution.cpp"
               ,0x5a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_b8);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_b0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_b8);
LAB_00127b2e:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
LAB_00127b33:
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  ~basic_string(&x);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  ~basic_string(&vec);
  mxx::comm::~comm(&c);
  return;
}

Assistant:

TEST(MxxDistribution, StableScatterBlockDistr) {
    mxx::comm c;
    std::basic_string<unsigned char> vec;
    size_t size = 40;
    if (c.rank() == c.size() / 2) {
        vec.resize(size);
        for (size_t i = 0; i < size; ++i) {
            vec[i] = static_cast<unsigned char>(i % 256);
        }
    }
    // test non-inplace
    std::basic_string<unsigned char> x = mxx::stable_distribute(vec, c);
    // test inplace
    mxx::stable_distribute_inplace(vec, c);

    size_t eq_size = size / c.size();
    if ((size_t)c.rank() < size % c.size())
        eq_size+=1;
    size_t prefix = mxx::exscan(eq_size, c);

    ASSERT_EQ(eq_size, x.size());
    ASSERT_EQ(eq_size, vec.size());

    for (size_t i = 0; i < eq_size; ++i) {
        ASSERT_EQ(static_cast<unsigned char>((prefix + i) % 256), x[i]);
        ASSERT_EQ(static_cast<unsigned char>((prefix + i) % 256), vec[i]);
    }
}